

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection_p.h
# Opt level: O3

QByteDataBuffer * __thiscall
QHttp2Stream::takeDownloadBuffer(QByteDataBuffer *__return_storage_ptr__,QHttp2Stream *this)

{
  QByteArray *pQVar1;
  qint64 qVar2;
  QByteDataBuffer *__old_val;
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  QArrayDataPointer<QByteArray> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0;
  uStack_48 = 0;
  pQVar1 = *(QByteArray **)(this + 0x48);
  (__return_storage_ptr__->buffers).d.d = *(Data **)(this + 0x40);
  (__return_storage_ptr__->buffers).d.ptr = pQVar1;
  (__return_storage_ptr__->buffers).d.size = *(qsizetype *)(this + 0x50);
  qVar2 = *(qint64 *)(this + 0x60);
  __return_storage_ptr__->bufferCompleteSize = *(qint64 *)(this + 0x58);
  __return_storage_ptr__->firstPos = qVar2;
  local_68.d = (Data *)0x0;
  local_68.ptr = (QByteArray *)0x0;
  local_68.size = 0;
  *(undefined8 *)(this + 0x40) = 0;
  local_38.d = (Data *)0x0;
  *(undefined8 *)(this + 0x48) = 0;
  local_38.ptr = (QByteArray *)0x0;
  *(undefined8 *)(this + 0x50) = 0;
  local_38.size = 0;
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
  *(undefined8 *)(this + 0x58) = local_50;
  *(undefined8 *)(this + 0x60) = uStack_48;
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteDataBuffer takeDownloadBuffer() noexcept { return std::exchange(m_downloadBuffer, {}); }